

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializers.hpp
# Opt level: O0

XMLNodeAdapter * BSDFData::operator<<(XMLNodeAdapter *node,Layer *layer)

{
  Layer *pLVar1;
  allocator<char> local_161;
  string local_160;
  Child<const_std::vector<BSDFData::WavelengthData,_std::allocator<BSDFData::WavelengthData>_>_>
  local_140;
  allocator<char> local_111;
  string local_110;
  Child<const_std::optional<BSDFData::DataDefinition>_> local_f0;
  allocator<char> local_c1;
  string local_c0;
  Child<const_std::optional<BSDFData::Geometry>_> local_a0;
  allocator<char> local_61;
  string local_60;
  Child<const_std::optional<BSDFData::Material>_> local_40;
  Layer *local_18;
  Layer *layer_local;
  XMLNodeAdapter *node_local;
  
  local_18 = layer;
  layer_local = (Layer *)node;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"Material",&local_61);
  FileParse::Child<const_std::optional<BSDFData::Material>_>::Child
            (&local_40,&local_60,&local_18->material,0);
  FileParse::operator<<(node,&local_40);
  FileParse::Child<const_std::optional<BSDFData::Material>_>::~Child(&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  pLVar1 = layer_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"Geometry",&local_c1);
  FileParse::Child<const_std::optional<BSDFData::Geometry>_>::Child
            (&local_a0,&local_c0,&local_18->geometry,0);
  FileParse::operator<<((XMLNodeAdapter *)pLVar1,&local_a0);
  FileParse::Child<const_std::optional<BSDFData::Geometry>_>::~Child(&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator(&local_c1);
  pLVar1 = layer_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_110,"DataDefinition",&local_111);
  FileParse::Child<const_std::optional<BSDFData::DataDefinition>_>::Child
            (&local_f0,&local_110,&local_18->dataDefinition,0);
  FileParse::operator<<((XMLNodeAdapter *)pLVar1,&local_f0);
  FileParse::Child<const_std::optional<BSDFData::DataDefinition>_>::~Child(&local_f0);
  std::__cxx11::string::~string((string *)&local_110);
  std::allocator<char>::~allocator(&local_111);
  pLVar1 = layer_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_160,"WavelengthData",&local_161);
  FileParse::
  Child<const_std::vector<BSDFData::WavelengthData,_std::allocator<BSDFData::WavelengthData>_>_>::
  Child(&local_140,&local_160,&local_18->wavelengthData,0);
  FileParse::operator<<((XMLNodeAdapter *)pLVar1,&local_140);
  FileParse::
  Child<const_std::vector<BSDFData::WavelengthData,_std::allocator<BSDFData::WavelengthData>_>_>::
  ~Child(&local_140);
  std::__cxx11::string::~string((string *)&local_160);
  std::allocator<char>::~allocator(&local_161);
  return (XMLNodeAdapter *)layer_local;
}

Assistant:

NodeAdapter & operator<<(NodeAdapter & node, const BSDFData::Layer & layer)
    {
        node << FileParse::Child{"Material", layer.material};
        node << FileParse::Child{"Geometry", layer.geometry};
        node << FileParse::Child{"DataDefinition", layer.dataDefinition};
        node << FileParse::Child{"WavelengthData", layer.wavelengthData};

        return node;
    }